

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcComplexProperty::~IfcComplexProperty(IfcComplexProperty *this)

{
  ~IfcComplexProperty((IfcComplexProperty *)
                      ((long)&(this->super_IfcProperty).
                              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
                              _vptr_ObjectHelper +
                      (long)(this->super_IfcProperty).
                            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
                            _vptr_ObjectHelper[-3]));
  return;
}

Assistant:

IfcComplexProperty() : Object("IfcComplexProperty") {}